

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O2

void __thiscall
slang::ast::Expression::visitExpression<slang::ast::Expression_const,slang::ast::DriverVisitor&>
          (Expression *this,Expression *expr,DriverVisitor *visitor)

{
  logic_error *this_00;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  switch(expr->kind) {
  case Invalid:
  case IntegerLiteral:
  case RealLiteral:
  case TimeLiteral:
  case UnbasedUnsizedIntegerLiteral:
  case NullLiteral:
  case UnboundedLiteral:
  case StringLiteral:
  case MemberAccess:
  case DataType:
  case TypeReference:
  case HierarchicalReference:
  case LValueReference:
  case EmptyArgument:
    return;
  case NamedValue:
  case HierarchicalValue:
    DriverVisitor::handle(visitor,(ValueExpressionBase *)expr);
    return;
  case UnaryOp:
    UnaryExpression::visitExprs<slang::ast::DriverVisitor&>((UnaryExpression *)expr,visitor);
    return;
  case BinaryOp:
    BinaryExpression::visitExprs<slang::ast::DriverVisitor&>((BinaryExpression *)expr,visitor);
    return;
  case ConditionalOp:
    ConditionalExpression::visitExprs<slang::ast::DriverVisitor&>
              ((ConditionalExpression *)expr,visitor);
    return;
  case Inside:
    InsideExpression::visitExprs<slang::ast::DriverVisitor&>((InsideExpression *)expr,visitor);
    return;
  case Assignment:
    AssignmentExpression::visitExprs<slang::ast::DriverVisitor&>
              ((AssignmentExpression *)expr,visitor);
    return;
  case Concatenation:
    ConcatenationExpression::visitExprs<slang::ast::DriverVisitor&>
              ((ConcatenationExpression *)expr,visitor);
    return;
  case Replication:
    ReplicationExpression::visitExprs<slang::ast::DriverVisitor&>
              ((ReplicationExpression *)expr,visitor);
    return;
  case Streaming:
    StreamingConcatenationExpression::visitExprs<slang::ast::DriverVisitor&>
              ((StreamingConcatenationExpression *)expr,visitor);
    return;
  case ElementSelect:
    ElementSelectExpression::visitExprs<slang::ast::DriverVisitor&>
              ((ElementSelectExpression *)expr,visitor);
    return;
  case RangeSelect:
    RangeSelectExpression::visitExprs<slang::ast::DriverVisitor&>
              ((RangeSelectExpression *)expr,visitor);
    return;
  case Call:
    DriverVisitor::handle(visitor,(CallExpression *)expr);
    return;
  case Conversion:
    ConversionExpression::visitExprs<slang::ast::DriverVisitor&>
              ((ConversionExpression *)expr,visitor);
    return;
  case SimpleAssignmentPattern:
  case StructuredAssignmentPattern:
    AssignmentPatternExpressionBase::visitExprs<slang::ast::DriverVisitor&>
              ((AssignmentPatternExpressionBase *)expr,visitor);
    return;
  case ReplicatedAssignmentPattern:
    ReplicatedAssignmentPatternExpression::visitExprs<slang::ast::DriverVisitor&>
              ((ReplicatedAssignmentPatternExpression *)expr,visitor);
    return;
  case OpenRange:
    OpenRangeExpression::visitExprs<slang::ast::DriverVisitor&>((OpenRangeExpression *)expr,visitor)
    ;
    return;
  case Dist:
    DistExpression::visitExprs<slang::ast::DriverVisitor&>((DistExpression *)expr,visitor);
    return;
  case NewArray:
    NewArrayExpression::visitExprs<slang::ast::DriverVisitor&>((NewArrayExpression *)expr,visitor);
    return;
  case NewClass:
    NewClassExpression::visitExprs<slang::ast::DriverVisitor&>((NewClassExpression *)expr,visitor);
    return;
  case NewCovergroup:
    NewCovergroupExpression::visitExprs<slang::ast::DriverVisitor&>
              ((NewCovergroupExpression *)expr,visitor);
    return;
  case CopyClass:
    CopyClassExpression::visitExprs<slang::ast::DriverVisitor&>((CopyClassExpression *)expr,visitor)
    ;
    return;
  case MinTypMax:
    MinTypMaxExpression::visitExprs<slang::ast::DriverVisitor&>((MinTypMaxExpression *)expr,visitor)
    ;
    return;
  case ClockingEvent:
    ClockingEventExpression::visitExprs<slang::ast::DriverVisitor&>
              ((ClockingEventExpression *)expr,visitor);
    return;
  case AssertionInstance:
    AssertionInstanceExpression::visitExprs<slang::ast::DriverVisitor&>
              ((AssertionInstanceExpression *)expr,visitor);
    return;
  case TaggedUnion:
    TaggedUnionExpression::visitExprs<slang::ast::DriverVisitor&>
              ((TaggedUnionExpression *)expr,visitor);
    return;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
               ,&local_d9);
    std::operator+(&local_98,&local_b8,":");
    std::__cxx11::to_string(&local_d8,0x15b);
    std::operator+(&local_78,&local_98,&local_d8);
    std::operator+(&local_58,&local_78,": ");
    std::operator+(&local_38,&local_58,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_38);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
}

Assistant:

decltype(auto) Expression::visitExpression(TExpression* expr, TVisitor&& visitor,
                                           Args&&... args) const {
    // clang-format off
#define CASE(k, n) case ExpressionKind::k: return visitor.visit(\
                        *static_cast<std::conditional_t<std::is_const_v<TExpression>, const n*, n*>>(expr),\
                            std::forward<Args>(args)...)

    switch (expr->kind) {
        case ExpressionKind::Invalid: return visitor.visitInvalid(*expr, std::forward<Args>(args)...);
        CASE(IntegerLiteral, IntegerLiteral);
        CASE(RealLiteral, RealLiteral);
        CASE(TimeLiteral, TimeLiteral);
        CASE(UnbasedUnsizedIntegerLiteral, UnbasedUnsizedIntegerLiteral);
        CASE(NullLiteral, NullLiteral);
        CASE(UnboundedLiteral, UnboundedLiteral);
        CASE(StringLiteral, StringLiteral);
        CASE(NamedValue, NamedValueExpression);
        CASE(HierarchicalValue, HierarchicalValueExpression);
        CASE(UnaryOp, UnaryExpression);
        CASE(BinaryOp, BinaryExpression);
        CASE(ConditionalOp, ConditionalExpression);
        CASE(Inside, InsideExpression);
        CASE(Assignment, AssignmentExpression);
        CASE(Concatenation, ConcatenationExpression);
        CASE(Replication, ReplicationExpression);
        CASE(Streaming, StreamingConcatenationExpression);
        CASE(ElementSelect, ElementSelectExpression);
        CASE(RangeSelect, RangeSelectExpression);
        CASE(MemberAccess, MemberAccessExpression);
        CASE(Call, CallExpression);
        CASE(Conversion, ConversionExpression);
        CASE(DataType, DataTypeExpression);
        CASE(TypeReference, TypeReferenceExpression);
        CASE(HierarchicalReference, HierarchicalReferenceExpression);
        CASE(LValueReference, LValueReferenceExpression);
        CASE(SimpleAssignmentPattern, SimpleAssignmentPatternExpression);
        CASE(StructuredAssignmentPattern, StructuredAssignmentPatternExpression);
        CASE(ReplicatedAssignmentPattern, ReplicatedAssignmentPatternExpression);
        CASE(EmptyArgument, EmptyArgumentExpression);
        CASE(OpenRange, OpenRangeExpression);
        CASE(Dist, DistExpression);
        CASE(NewArray, NewArrayExpression);
        CASE(NewClass, NewClassExpression);
        CASE(NewCovergroup, NewCovergroupExpression);
        CASE(CopyClass, CopyClassExpression);
        CASE(MinTypMax, MinTypMaxExpression);
        CASE(ClockingEvent, ClockingEventExpression);
        CASE(AssertionInstance, AssertionInstanceExpression);
        CASE(TaggedUnion, TaggedUnionExpression);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}